

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O2

void do_abs(void *x,int n,int type)

{
  float fVar1;
  double dVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  int iVar6;
  long lVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  
  if (type == -99) {
    uVar5 = 0;
    uVar8 = (ulong)(uint)n;
    if (n < 1) {
      uVar8 = uVar5;
    }
    for (; uVar8 != uVar5; uVar5 = uVar5 + 1) {
      iVar3 = *(int *)((long)x + uVar5 * 4);
      iVar6 = -iVar3;
      if (0 < iVar3) {
        iVar6 = iVar3;
      }
      *(int *)((long)x + uVar5 * 4) = iVar6;
    }
  }
  else if (type == -0x132) {
    uVar5 = 0;
    uVar8 = (ulong)(uint)n;
    if (n < 1) {
      uVar8 = uVar5;
    }
    for (; uVar8 != uVar5; uVar5 = uVar5 + 1) {
      fVar1 = *(float *)((long)x + uVar5 * 4);
      uVar9 = -(uint)(fVar1 < -fVar1);
      *(uint *)((long)x + uVar5 * 4) = ~uVar9 & (uint)fVar1 | (uint)-fVar1 & uVar9;
    }
  }
  else if (type == -0x66) {
    uVar5 = 0;
    uVar8 = (ulong)(uint)n;
    if (n < 1) {
      uVar8 = uVar5;
    }
    for (; uVar8 != uVar5; uVar5 = uVar5 + 1) {
      lVar4 = *(long *)((long)x + uVar5 * 8);
      lVar7 = -lVar4;
      if (0 < lVar4) {
        lVar7 = lVar4;
      }
      *(long *)((long)x + uVar5 * 8) = lVar7;
    }
  }
  else if (type == -0x65) {
    uVar5 = 0;
    uVar8 = (ulong)(uint)n;
    if (n < 1) {
      uVar8 = uVar5;
    }
    for (; uVar8 != uVar5; uVar5 = uVar5 + 1) {
      lVar4 = *(long *)((long)x + uVar5 * 8);
      lVar7 = -lVar4;
      if (0 < lVar4) {
        lVar7 = lVar4;
      }
      *(long *)((long)x + uVar5 * 8) = lVar7;
    }
  }
  else {
    if (type != -0x133) {
      comex_error("unsupported ABS operation",1);
      return;
    }
    uVar5 = 0;
    uVar8 = (ulong)(uint)n;
    if (n < 1) {
      uVar8 = uVar5;
    }
    for (; uVar8 != uVar5; uVar5 = uVar5 + 1) {
      dVar2 = *(double *)((long)x + uVar5 * 8);
      uVar10 = -(ulong)(dVar2 < -dVar2);
      *(ulong *)((long)x + uVar5 * 8) = ~uVar10 & (ulong)dVar2 | (ulong)-dVar2 & uVar10;
    }
  }
  return;
}

Assistant:

static void do_abs(void *x, int n, int type)
{
#define ARMCI_ABS_INT(a)  (((a) >= 0)   ? (a) : (-(a)))
#define ARMCI_ABS_FLT(a)  (((a) >= 0.0) ? (a) : (-(a)))
#define DO_ABS(ARMCI_TYPE, C_TYPE, WHICH)       \
    if (type == ARMCI_TYPE) {                   \
        int i;                                  \
        C_TYPE *y = (C_TYPE *)x;                \
        for (i = 0; i < n; i++) {               \
            y[i] = ARMCI_ABS_##WHICH(y[i]);     \
        }                                       \
    }                                           \
    else
    DO_ABS(ARMCI_INT,       int,        INT)
    DO_ABS(ARMCI_LONG,      long,       INT)
    DO_ABS(ARMCI_LONG_LONG, long long,  INT)
    DO_ABS(ARMCI_FLOAT,     float,      FLT)
    DO_ABS(ARMCI_DOUBLE,    double,     FLT)
    {
        comex_error("unsupported ABS operation", 1);
    }
#undef ARMCI_ABS_INT
#undef ARMCI_ABS_FLT
#undef DO_ABS
}